

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayalgorithms.h
# Opt level: O0

longlong QtPrivate::toIntegral<long_long,QByteArrayView,void>(QByteArrayView data,bool *ok,int base)

{
  long lVar1;
  bool bVar2;
  longlong *plVar3;
  byte *in_RDX;
  long in_FS_OFFSET;
  bool bVar4;
  bool failed;
  ParsedNumber<long_long> val;
  anon_class_16_2_3ef97100 *in_stack_ffffffffffffff88;
  longlong local_50;
  undefined1 local_38 [16];
  undefined1 *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  toIntegral<long_long,_QByteArrayView,_void>::anon_class_16_2_3ef97100::operator()
            (in_stack_ffffffffffffff88);
  bVar2 = ParsedNumber::operator_cast_to_bool((ParsedNumber *)local_38);
  bVar4 = true;
  if (bVar2) {
    plVar3 = ParsedNumber<long_long>::operator*((ParsedNumber<long_long> *)local_38);
    lVar1 = *plVar3;
    plVar3 = ParsedNumber<long_long>::operator*((ParsedNumber<long_long> *)local_38);
    bVar4 = lVar1 != *plVar3;
  }
  if (in_RDX != (byte *)0x0) {
    *in_RDX = bVar4 ^ 1;
  }
  if (bVar4) {
    local_50 = 0;
  }
  else {
    plVar3 = ParsedNumber<long_long>::operator*((ParsedNumber<long_long> *)local_38);
    local_50 = *plVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

static inline T toIntegral(ByteArrayView data, bool *ok, int base)
{
    const auto val = [&] {
        if constexpr (std::is_unsigned_v<T>)
            return toUnsignedInteger(data, base);
        else
            return toSignedInteger(data, base);
    }();
    const bool failed = !val || T(*val) != *val;
    if (ok)
        *ok = !failed;
    if (failed)
        return 0;
    return T(*val);
}